

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QByteArray * QString::toLatin1_helper_inplace(QByteArray *__return_storage_ptr__,QString *s)

{
  Data *pDVar1;
  char16_t *src;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  QStringView string;
  QArrayDataPointer<char> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (s->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 1)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      string.m_data = (s->d).ptr;
      string.m_size = (s->d).size;
      qt_convert_to_latin1(__return_storage_ptr__,string);
      return __return_storage_ptr__;
    }
  }
  else {
    src = (s->d).ptr;
    qt_to_latin1((uchar *)src,src,(s->d).size + 1);
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<char16_t>::reinterpreted<char>(&local_38,&s->d);
    qVar4 = local_38.size;
    pcVar3 = local_38.ptr;
    pDVar2 = local_38.d;
    local_38.d = (Data *)0x0;
    local_38.ptr = (char *)0x0;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = pcVar3;
    local_38.size = 0;
    (__return_storage_ptr__->d).size = qVar4;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QString::toLatin1_helper_inplace(QString &s)
{
    if (!s.isDetached())
        return qt_convert_to_latin1(s);

    // We can return our own buffer to the caller.
    // Conversion to Latin-1 always shrinks the buffer by half.
    // This relies on the fact that we use QArrayData for everything behind the scenes

    // First, do the in-place conversion. Since isDetached() == true, the data
    // was allocated by QArrayData, so the null terminator must be there.
    qsizetype length = s.size();
    char16_t *sdata = s.d->data();
    Q_ASSERT(sdata[length] == u'\0');
    qt_to_latin1(reinterpret_cast<uchar *>(sdata), sdata, length + 1);

    // Move the internals over to the byte array.
    // Kids, avert your eyes. Don't try this at home.
    auto ba_d = std::move(s.d).reinterpreted<char>();

    // Some sanity checks
    Q_ASSERT(ba_d.d->allocatedCapacity() >= ba_d.size);
    Q_ASSERT(s.isNull());
    Q_ASSERT(s.isEmpty());
    Q_ASSERT(s.constData() == QString().constData());

    return QByteArray(std::move(ba_d));
}